

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O2

iterator __thiscall
fmt::v5::internal::
arg_formatter_base<fmt::v5::output_range<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
::operator()(arg_formatter_base<fmt::v5::output_range<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
             *this,basic_string_view<char> value)

{
  size_t in_RCX;
  error_handler local_19;
  
  if (this->specs_ == (format_specs *)0x0) {
    basic_writer<fmt::v5::output_range<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
    ::write(&this->writer_,(int)value.data_,(void *)value.size_,in_RCX);
  }
  else {
    check_string_type_spec<char,fmt::v5::internal::error_handler>(this->specs_->type_,&local_19);
    basic_writer<fmt::v5::output_range<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
    ::write_str<char>(&this->writer_,value,this->specs_);
  }
  return (iterator)(this->writer_).out_.container;
}

Assistant:

iterator operator()(basic_string_view<char_type> value) {
    if (specs_) {
      internal::check_string_type_spec(
            specs_->type_, internal::error_handler());
      writer_.write_str(value, *specs_);
    } else {
      writer_.write(value);
    }
    return out();
  }